

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hnsw.hpp
# Opt level: O1

void __thiscall hnsw::HNSWIndex::Insert(HNSWIndex *this,index_t q)

{
  pointer this_00;
  PointSet *candidates_00;
  layer_t *plVar1;
  uint M;
  pointer pVVar2;
  pointer ppfVar3;
  long lVar4;
  pointer ppVar5;
  bool bVar6;
  pointer ppVar7;
  layer_t lVar8;
  int iVar9;
  layer_t *plVar10;
  uint32_t *puVar11;
  Point *p;
  float *q_00;
  pointer ppVar12;
  int iVar13;
  pointer this_01;
  uint32_t uVar14;
  long lVar15;
  Point ep;
  PointSet selected_points;
  MaxHeap candidates;
  Point local_c0;
  undefined1 local_b8 [16];
  pointer local_a8;
  layer_t *local_a0;
  layer_t *local_98;
  float *local_90;
  uint32_t *local_88;
  uint32_t *local_80;
  long local_78;
  pointer local_70;
  PointSet local_68;
  MaxHeap local_50;
  
  pVVar2 = (this->vertices_).
           super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pVVar2[q].layer != 0) ||
     (this_00 = pVVar2 + q,
     (this_00->neighbors).
     super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish !=
     (this_00->neighbors).
     super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)) {
    __assert_fail("vertex.layer == 0 && vertex.neighbors.size() == 0 && \"Vertex has already been inserted\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KinglittleQ[P]hnsw/include/hnsw.hpp"
                  ,0x5a,"void hnsw::HNSWIndex::Insert(index_t)");
  }
  lVar8 = RandomChoiceLayer(this);
  this_00->layer = lVar8;
  std::
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ::resize(&this_00->neighbors,(long)(lVar8 + 1));
  this_01 = (this_00->neighbors).
            super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while (this_01 = this_01 + 1,
        this_01 !=
        (this_00->neighbors).
        super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    reserve(this_01,(ulong)this->maxM_);
  }
  plVar1 = &pVVar2[q].layer;
  std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
  reserve((this_00->neighbors).
          super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start,(ulong)this->maxM0_);
  uVar14 = this->num_points_;
  this->num_points_ = uVar14 + 1;
  if (uVar14 == 0) {
    iVar13 = *plVar1;
  }
  else {
    ppfVar3 = (this->points_).row_ptrs_.
              super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    q_00 = ppfVar3[q];
    local_70 = this_00;
    (**this->distance_->_vptr_Distance)(this->distance_,q_00,ppfVar3[this->ep_]);
    local_c0.first = this->ep_;
    local_a0 = &this->top_layer_;
    iVar13 = this->top_layer_;
    iVar9 = *plVar1;
    if (iVar9 < iVar13) {
      do {
        SearchUpperLayer(this,q_00,&local_c0,iVar13);
        iVar13 = iVar13 + -1;
        iVar9 = *plVar1;
      } while (iVar9 < iVar13);
    }
    plVar10 = plVar1;
    if (*local_a0 < iVar9) {
      plVar10 = local_a0;
    }
    local_98 = plVar1;
    if (-1 < (long)*plVar10) {
      local_80 = &this->maxM0_;
      local_88 = &this->maxM_;
      lVar15 = (long)*plVar10;
      local_90 = q_00;
      do {
        local_78 = lVar15 + -1;
        puVar11 = local_88;
        if (lVar15 == 0) {
          puVar11 = local_80;
        }
        M = *puVar11;
        uVar14 = (uint32_t)lVar15;
        SearchLayer(&local_50,this,q_00,&local_c0,this->ef_construction_,uVar14);
        SelectNeighborsHeuristic(&local_68,this,q_00,(PointSet *)&local_50,this->M_);
        ppVar7 = local_68.
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_68.
            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_68.
            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          ppVar12 = local_68.
                    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            Vertex::ConnectTo((this->vertices_).
                              super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>
                              ._M_impl.super__Vector_impl_data._M_start + ppVar12->first,q,
                              ppVar12->second,uVar14);
            Vertex::ConnectTo(local_70,ppVar12->first,ppVar12->second,uVar14);
            lVar4 = *(long *)&(this->vertices_).
                              super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>
                              ._M_impl.super__Vector_impl_data._M_start[ppVar12->first].neighbors.
                              super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                              ._M_impl;
            if ((ulong)M <
                (ulong)(*(long *)(lVar4 + 8 + lVar15 * 0x18) - *(long *)(lVar4 + lVar15 * 0x18) >> 3
                       )) {
              candidates_00 = (PointSet *)(lVar4 + lVar15 * 0x18);
              SelectNeighborsHeuristic
                        ((PointSet *)local_b8,this,
                         (this->points_).row_ptrs_.
                         super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
                         super__Vector_impl_data._M_start[ppVar12->first],candidates_00,M);
              ppVar5 = (candidates_00->
                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              (candidates_00->
              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              )._M_impl.super__Vector_impl_data._M_start = (pointer)local_b8._0_8_;
              (candidates_00->
              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              )._M_impl.super__Vector_impl_data._M_finish = (pointer)local_b8._8_8_;
              (candidates_00->
              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage = local_a8;
              local_b8 = ZEXT816(0) << 0x20;
              local_a8 = (pointer)0x0;
              if (ppVar5 != (pointer)0x0) {
                operator_delete(ppVar5);
              }
              if ((pointer)local_b8._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_b8._0_8_);
              }
            }
            ppVar12 = ppVar12 + 1;
          } while (ppVar12 != ppVar7);
        }
        if (local_68.
            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.
                          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        q_00 = local_90;
        if (local_50.super_MaxHeapImpl.c.
            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.super_MaxHeapImpl.c.
                          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        bVar6 = 0 < lVar15;
        lVar15 = local_78;
      } while (bVar6);
    }
    iVar13 = *local_98;
    if (iVar13 <= *local_a0) {
      return;
    }
  }
  this->top_layer_ = iVar13;
  this->ep_ = q;
  return;
}

Assistant:

void Insert(index_t q) {
    Vertex &vertex = vertices_[q];
    assert(vertex.layer == 0 && vertex.neighbors.size() == 0 && "Vertex has already been inserted");
    vertex.layer = RandomChoiceLayer();
    vertex.neighbors.resize(vertex.layer + 1);
    for (auto iter = vertex.neighbors.begin() + 1; iter != vertex.neighbors.end(); iter++) {
      iter->reserve(maxM_);
    }
    vertex.neighbors[0].reserve(maxM0_);

    num_points_ += 1;

    if (num_points_ == 1) {
      top_layer_ = vertex.layer;
      ep_ = q;
      return;
    }

    const float *query = points_[q];
    Point ep(ep_, distance_(query, points_[ep_]));
    for (layer_t l = top_layer_; l > vertex.layer; l--) {
      SearchUpperLayer(query, ep, l);
    }

    // Search neighbors and connect to them
    for (layer_t l = std::min(vertex.layer, top_layer_); l >= 0; l--) {
      uint32_t maxM = (l == 0) ? maxM0_ : maxM_;
      MaxHeap candidates = SearchLayer(query, ep, ef_construction_, l);
      PointSet selected_points =
          SelectNeighborsHeuristic(query, candidates.Container(), M_);  // next ep

      for (const Point &p : selected_points) {
        vertices_[p.first].ConnectTo(q, p.second, l);
        vertex.ConnectTo(p.first, p.second, l);

        // Shrink neighbors
        auto &edges = vertices_[p.first].neighbors[l];
        if (edges.size() > maxM) {
          edges = SelectNeighborsHeuristic(points_[p.first], edges, maxM);
        }
      }
    }

    if (vertex.layer > top_layer_) {
      top_layer_ = vertex.layer;
      ep_ = q;
    }

    return;
  }